

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixtree.hpp
# Opt level: O0

void __thiscall RadixTree::insert(RadixTree *this,uint64_t vadd,uint64_t padd)

{
  reference ppvVar1;
  value_type pvVar2;
  reference ppvVar3;
  reference ppvVar4;
  value_type pvVar5;
  uint64_t uVar6;
  reference pvVar7;
  uint64_t in_RDX;
  uint64_t in_RSI;
  vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
  *in_RDI;
  uint16_t p1k;
  uint16_t p2k;
  uint16_t p3k;
  uint16_t p4k;
  allocator_type *in_stack_ffffffffffffff80;
  allocator_type *__a;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
  *in_stack_ffffffffffffff88;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
  *in_stack_ffffffffffffff90;
  allocator_type local_38;
  undefined1 local_37;
  undefined1 local_35;
  uint16_t local_20;
  uint16_t local_1e;
  uint16_t local_1c;
  uint16_t local_1a;
  uint64_t local_18;
  uint64_t local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1a = p4_key(in_RSI);
  local_1c = p3_key(local_10);
  local_1e = p2_key(local_10);
  local_20 = p1_key(local_10);
  ppvVar1 = std::
            vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
            ::operator[](in_RDI,(ulong)local_1a);
  if (*ppvVar1 == (value_type)0x0) {
    pvVar2 = (value_type)operator_new(0x18);
    local_35 = 1;
    std::
    allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>
    ::allocator((allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>
                 *)0x102fb7);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
    ::vector(in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
             (allocator_type *)in_stack_ffffffffffffff80);
    local_35 = 0;
    ppvVar1 = std::
              vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
              ::operator[](in_RDI,(ulong)local_1a);
    *ppvVar1 = pvVar2;
    std::
    allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>
    ::~allocator((allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>
                  *)0x102ff5);
  }
  ppvVar1 = std::
            vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
            ::operator[](in_RDI,(ulong)local_1a);
  ppvVar3 = std::
            vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
            ::operator[](*ppvVar1,(ulong)local_1c);
  if (*ppvVar3 == (value_type)0x0) {
    in_stack_ffffffffffffff88 =
         (vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
          *)operator_new(0x18);
    local_37 = 1;
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff88;
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>::allocator
              ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*> *)0x10307e);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
    ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
              *)in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80);
    local_37 = 0;
    ppvVar1 = std::
              vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
              ::operator[](in_RDI,(ulong)local_1a);
    ppvVar3 = std::
              vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
              ::operator[](*ppvVar1,(ulong)local_1c);
    *ppvVar3 = (value_type)in_stack_ffffffffffffff88;
    std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>::~allocator
              ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*> *)0x1030cb);
  }
  ppvVar1 = std::
            vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
            ::operator[](in_RDI,(ulong)local_1a);
  ppvVar3 = std::
            vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
            ::operator[](*ppvVar1,(ulong)local_1c);
  ppvVar4 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
            ::operator[](*ppvVar3,(ulong)local_1e);
  if (*ppvVar4 == (value_type)0x0) {
    pvVar5 = (value_type)operator_new(0x18);
    __a = &local_38;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x103163);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90,
               (size_type)in_stack_ffffffffffffff88,__a);
    ppvVar1 = std::
              vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
              ::operator[](in_RDI,(ulong)local_1a);
    ppvVar3 = std::
              vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
              ::operator[](*ppvVar1,(ulong)local_1c);
    ppvVar4 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
              ::operator[](*ppvVar3,(ulong)local_1e);
    *ppvVar4 = pvVar5;
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1031bf);
  }
  uVar6 = pb_add(local_18);
  ppvVar1 = std::
            vector<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
            ::operator[](in_RDI,(ulong)local_1a);
  ppvVar3 = std::
            vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
            ::operator[](*ppvVar1,(ulong)local_1c);
  ppvVar4 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
            ::operator[](*ppvVar3,(ulong)local_1e);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (*ppvVar4,(ulong)local_20);
  *pvVar7 = uVar6 << 0xc;
  in_RDI[1].
  super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)in_RDI[1].
                       super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  return;
}

Assistant:

void insert(uint64_t vadd, uint64_t padd) {
    uint16_t p4k = p4_key(vadd);
    uint16_t p3k = p3_key(vadd);
    uint16_t p2k = p2_key(vadd);
    uint16_t p1k = p1_key(vadd);
    if(t_[p4k] == NULL)
      t_[p4k] = new vector< vector< vector<uint64_t>* >* >(p3_size);
    if((*t_[p4k])[p3k] == NULL)
      (*t_[p4k])[p3k] = new vector< vector<uint64_t>* >(p2_size);
    if((*(*t_[p4k])[p3k])[p2k] == NULL)
      (*(*t_[p4k])[p3k])[p2k] = new vector<uint64_t>(p1_size);
    (*(*(*t_[p4k])[p3k])[p2k])[p1k] = pb_add(padd) << 12;
    ++s_;
  }